

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O0

void __thiscall AddressFilter::AddToList(AddressFilter *this,uint8_t *addr,size_t len)

{
  IPAsKey *this_00;
  bool local_35 [8];
  bool stored;
  IPAsKey *local_28;
  IPAsKey *x;
  size_t len_local;
  uint8_t *addr_local;
  AddressFilter *this_local;
  
  x = (IPAsKey *)len;
  len_local = (size_t)addr;
  addr_local = (uint8_t *)this;
  this_00 = (IPAsKey *)operator_new(0x30);
  IPAsKey::IPAsKey(this_00,(uint8_t *)len_local,(size_t)x);
  if (this_00 != (IPAsKey *)0x0) {
    local_35[0] = false;
    local_28 = this_00;
    BinHash<IPAsKey>::InsertOrAdd(&this->table,this_00,false,local_35);
    if (((local_35[0] & 1U) == 0) && (local_28 != (IPAsKey *)0x0)) {
      (*local_28->_vptr_IPAsKey[1])();
    }
  }
  return;
}

Assistant:

void AddressFilter::AddToList(uint8_t * addr, size_t len)
{
    IPAsKey * x = new IPAsKey(addr, len);

    if (x != NULL)
    {
        bool stored = false;

        (void)table.InsertOrAdd(x, false, &stored);

        if (!stored)
        {
            delete x;
        }
    }
}